

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t intersection_uint32(uint32_t *A,size_t lenA,uint32_t *B,size_t lenB,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint uVar5;
  
  if (lenB == 0 || lenA == 0) {
    return 0;
  }
  puVar1 = A + lenA;
  puVar2 = B + lenB;
  puVar4 = out;
LAB_001037c7:
  uVar5 = *B;
  do {
    uVar3 = *A;
    if (uVar5 <= uVar3) {
      while( true ) {
        uVar5 = *B;
        if (uVar3 <= uVar5) break;
        B = B + 1;
        if (B == puVar2) goto LAB_0010380b;
      }
      if (uVar3 == uVar5) break;
    }
    A = A + 1;
    if (A == puVar1) goto LAB_0010380b;
  } while( true );
  *puVar4 = uVar3;
  puVar4 = puVar4 + 1;
  A = A + 1;
  if ((A == puVar1) || (B = B + 1, B == puVar2)) {
LAB_0010380b:
    return (long)puVar4 - (long)out >> 2;
  }
  goto LAB_001037c7;
}

Assistant:

size_t intersection_uint32(const uint32_t *A, const size_t lenA,
                           const uint32_t *B, const size_t lenB,
                           uint32_t *out) {
    const uint32_t *initout = out;
    if (lenA == 0 || lenB == 0) return 0;
    const uint32_t *endA = A + lenA;
    const uint32_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return (out - initout);
        }
        while (*A > *B) {
            if (++B == endB) return (out - initout);
        }
        if (*A == *B) {
            *out++ = *A;
            if (++A == endA || ++B == endB) return (out - initout);
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    // return (out - initout);  // NOTREACHED
}